

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O2

QMap<int,_QVariant> __thiscall
RoleMaskProxyModel::itemData(RoleMaskProxyModel *this,QModelIndex *index)

{
  _Rb_tree_node_base *key;
  RoleMaskProxyModelPrivate *this_00;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  QVar2;
  bool bVar3;
  long lVar4;
  FlaggedRolesContainer *other;
  const_iterator cVar5;
  long *plVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  QModelIndex *in_RDX;
  const_iterator cVar9;
  _Rb_tree_node_base *p_Var10;
  RolesContainer result;
  QMap<int,_QVariant> baseData;
  QModelIndex sourceIdx;
  QMap<int,_QVariant> local_60;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  local_58;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  local_50;
  QModelIndex local_48;
  
  bVar3 = QModelIndex::isValid(in_RDX);
  if ((bVar3) && (lVar4 = QAbstractProxyModel::sourceModel(), lVar4 != 0)) {
    this_00 = (RoleMaskProxyModelPrivate *)index->m;
    local_60.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)0x0;
    (**(code **)(*(long *)index + 400))(&local_48,index);
    other = RoleMaskProxyModelPrivate::dataForIndex(this_00,&local_48);
    if (other != (FlaggedRolesContainer *)0x0) {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::operator=(&local_60.d,
                  (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                   *)other);
      local_58.d._0_4_ = 0;
      cVar5 = QMap<int,_QVariant>::find(&local_60,(int *)&local_58);
      if (this_00->m_mergeDisplayEdit == true) {
        cVar9._M_node = (_Base_ptr)((long)local_60.d.d + 0x10);
        if (local_60.d.d ==
            (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
             *)0x0) {
          cVar9._M_node = (_Base_ptr)0x0;
        }
        if (cVar5.i._M_node != (const_iterator)cVar9._M_node) {
          local_58.d._0_4_ = 2;
          QMap<int,_QVariant>::insert
                    (&local_60,(int *)&local_58,(QVariant *)((long)cVar5.i._M_node + 0x28));
        }
      }
    }
    plVar6 = (long *)QAbstractProxyModel::sourceModel();
    (**(code **)(*plVar6 + 0xb0))(&local_58,plVar6,&local_48);
    lVar4 = CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    if (lVar4 == 0) {
      p_Var7 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var7 = *(_Rb_tree_node_base **)(lVar4 + 0x20);
    }
    p_Var10 = (_Rb_tree_node_base *)(lVar4 + 0x10);
    if (lVar4 == 0) {
      p_Var10 = (_Rb_tree_node_base *)0x0;
    }
    local_50.d = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)this;
    for (; p_Var7 != p_Var10; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      key = p_Var7 + 1;
      bVar3 = QMap<int,_QVariant>::contains(&local_60,(int *)key);
      if ((!bVar3) &&
         ((bVar3 = QHash<int,_QHashDummyValue>::contains
                             (&(this_00->m_maskedRoles).q_hash,(int *)key), !bVar3 ||
          (this_00->m_transparentIfEmpty == true)))) {
        QMap<int,_QVariant>::insert(&local_60,(int *)key,(QVariant *)&p_Var7[1]._M_parent);
      }
    }
    if (this_00->m_transparentIfEmpty == false) {
      pQVar1 = (this_00->m_defaultValues).d.d;
      if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var8 = (_Base_ptr)0x0;
      }
      else {
        p_Var8 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var7 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var7 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var8 != p_Var7; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        bVar3 = QMap<int,_QVariant>::contains(&local_60,(int *)(p_Var8 + 1));
        if (!bVar3) {
          QMap<int,_QVariant>::insert
                    (&local_60,(int *)(p_Var8 + 1),(QVariant *)&p_Var8[1]._M_parent);
        }
      }
    }
    QVar2.d = local_50.d;
    *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      *)local_50.d = local_60.d.d;
    if (local_60.d.d !=
        (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
         *)0x0) {
      LOCK();
      *(int *)local_60.d.d = *(int *)local_60.d.d + 1;
      UNLOCK();
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_60.d);
    return (QMap<int,_QVariant>)
           (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )QVar2.d;
  }
  *(undefined8 *)this = 0;
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> RoleMaskProxyModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid() || !sourceModel())
        return QMap<int, QVariant>();
    Q_D(const RoleMaskProxyModel);
    RolesContainer result;
    const QModelIndex sourceIdx = mapToSource(index);
    const FlaggedRolesContainer *maskedData = d->dataForIndex(sourceIdx);
    if (maskedData) {
        result = maskedData->roles;
        const auto displayIter = result.constFind(Qt::DisplayRole);
        if (d->m_mergeDisplayEdit && displayIter != result.cend())
            result.insert(Qt::EditRole, displayIter.value());
    }
    const QMap<int, QVariant> baseData = sourceModel()->itemData(sourceIdx);
    for (auto i = baseData.cbegin(), baseEnd = baseData.cend(); i != baseEnd; ++i) {
        if (!result.contains(i.key()) && (!d->m_maskedRoles.contains(i.key()) || d->m_transparentIfEmpty))
            result.insert(i.key(), i.value());
    }
    if (!d->m_transparentIfEmpty) {
        for (auto i = d->m_defaultValues.cbegin(), iEnd = d->m_defaultValues.cend(); i != iEnd; ++i) {
            if (!result.contains(i.key()))
                result.insert(i.key(), i.value());
        }
    }
    return convertFromContainer<QMap<int, QVariant>>(result);
}